

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

void __thiscall caffe::ImageDataParameter::MergeFrom(ImageDataParameter *this,Message *from)

{
  LogMessage *other;
  ImageDataParameter *from_00;
  LogFinisher local_51;
  LogMessage local_50;
  
  if ((ImageDataParameter *)from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
               ,0x6fbb);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  from_00 = (ImageDataParameter *)
            __dynamic_cast(from,&google::protobuf::Message::typeinfo,&typeinfo,0);
  if (from_00 == (ImageDataParameter *)0x0) {
    google::protobuf::internal::ReflectionOps::Merge(from,&this->super_Message);
  }
  else {
    MergeFrom(this,from_00);
  }
  return;
}

Assistant:

void ImageDataParameter::MergeFrom(const ::google::protobuf::Message& from) {
// @@protoc_insertion_point(generalized_merge_from_start:caffe.ImageDataParameter)
  GOOGLE_DCHECK_NE(&from, this);
  const ImageDataParameter* source =
      ::google::protobuf::internal::DynamicCastToGenerated<const ImageDataParameter>(
          &from);
  if (source == NULL) {
  // @@protoc_insertion_point(generalized_merge_from_cast_fail:caffe.ImageDataParameter)
    ::google::protobuf::internal::ReflectionOps::Merge(from, this);
  } else {
  // @@protoc_insertion_point(generalized_merge_from_cast_success:caffe.ImageDataParameter)
    MergeFrom(*source);
  }
}